

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O3

int main(int argc,char **argv)

{
  int __fd;
  byte *pbVar1;
  size_t __size;
  int iVar2;
  j1939cat_priv *priv;
  ulong uVar3;
  uint8_t *puVar4;
  int *piVar5;
  __off_t _Var6;
  sockaddr_can *psVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  size_t _min2;
  sockaddr_can *psVar12;
  bool bVar13;
  bool bVar14;
  uint sock_opt;
  size_t _min1;
  pollfd local_84;
  int local_7c;
  sockaddr_can *local_78;
  sockaddr_can *local_70;
  int *local_68;
  int local_5c;
  sockaddr_can *local_58;
  uint8_t *local_50;
  ulong local_48;
  sockaddr_can *local_40;
  undefined4 local_34;
  
  priv = (j1939cat_priv *)calloc(1,0xb0);
  if (priv == (j1939cat_priv *)0x0) {
    pcVar11 = "can\'t allocate priv";
LAB_00102beb:
    err(1,pcVar11);
  }
  piVar5 = &priv->todo_prio;
  priv->todo_prio = -1;
  priv->outfile = 1;
  priv->max_transfer = 0x6fffff9;
  priv->polltimeout = 100000;
  priv->repeat = 1;
  local_70 = &priv->sockname;
  (priv->sockname).can_family = 0x1d;
  (priv->sockname).can_addr.j1939.addr = 0xff;
  (priv->sockname).can_addr.j1939.pgn = 0x40000;
  local_78 = &priv->peername;
  (priv->peername).can_family = 0x1d;
  (priv->peername).can_addr.j1939.addr = 0xff;
  (priv->peername).can_addr.j1939.pgn = 0x40000;
  local_68 = &priv->todo_broadcast;
LAB_001024b0:
  do {
    while( true ) {
      while (iVar2 = getopt(argc,argv,"?hi:vs:rp:P:R:B"), 0x68 < iVar2) {
        if (iVar2 < 0x72) {
          if (iVar2 == 0x69) {
            iVar2 = open(_optarg,0);
            priv->infile = iVar2;
            if (iVar2 == -1) {
              pcVar11 = "can\'t open input file";
              goto LAB_00102beb;
            }
            priv->todo_filesize = true;
          }
          else {
            if (iVar2 != 0x70) goto LAB_00102859;
            uVar3 = strtoul(_optarg,(char **)0x0,0);
            *piVar5 = (int)uVar3;
          }
        }
        else if (iVar2 == 0x72) {
          priv->todo_recv = true;
        }
        else {
          if (iVar2 != 0x73) goto LAB_00102859;
          uVar3 = strtoul(_optarg,(char **)0x0,0);
          priv->max_transfer = uVar3;
          if (0x6fffff9 < uVar3) {
            err(1,"used value (%zu) is bigger then allowed maximal size: %u.\n",uVar3,0x6fffff9);
          }
        }
      }
      if (iVar2 < 0x52) break;
      if (iVar2 == 0x52) {
        uVar3 = strtoul(_optarg,(char **)0x0,0);
        priv->repeat = uVar3;
        if (uVar3 == 0) {
          pcVar11 = "send/repeat count can\'t be less then 1\n";
          goto LAB_00102beb;
        }
      }
      else {
        if (iVar2 != 99) {
LAB_00102859:
          main_cold_1();
          return 1;
        }
        priv->todo_connect = true;
      }
    }
    if (iVar2 != 0x42) {
      if (iVar2 != 0x50) {
        if (iVar2 != -1) goto LAB_00102859;
        pbVar1 = (byte *)argv[_optind];
        if (pbVar1 != (byte *)0x0) {
          uVar8 = *pbVar1 - 0x2d;
          if (uVar8 == 0) {
            uVar8 = (uint)pbVar1[1];
          }
          iVar2 = _optind;
          if (uVar8 != 0) {
            libj1939_parse_canaddr((char *)pbVar1,local_70);
            iVar2 = _optind;
          }
          _optind = iVar2 + 1;
          pbVar1 = (byte *)argv[(long)iVar2 + 1];
          if (pbVar1 != (byte *)0x0) {
            uVar8 = *pbVar1 - 0x2d;
            if (uVar8 == 0) {
              uVar8 = (uint)pbVar1[1];
            }
            if (uVar8 != 0) {
              libj1939_parse_canaddr((char *)pbVar1,local_78);
              priv->valid_peername = true;
            }
            _optind = _optind + 1;
          }
        }
        iVar2 = socket(0x1d,2,7);
        priv->sock = iVar2;
        if (iVar2 < 0) {
          pcVar11 = "socket(j1939)";
        }
        else {
          if (-1 < *piVar5) {
            iVar2 = setsockopt(iVar2,0x6b,3,piVar5,4);
            if (iVar2 < 0) {
              warn("set priority %i",*piVar5);
              return 1;
            }
            iVar2 = priv->sock;
          }
          local_34 = 1;
          iVar2 = setsockopt(iVar2,0x6b,4,&local_34,4);
          if (iVar2 < 0) {
            pcVar11 = "set recverr";
          }
          else {
            local_84.fd = 0x1f98;
            iVar2 = setsockopt(priv->sock,1,0x25,&local_84,4);
            if (iVar2 != 0) {
              pcVar11 = "setsockopt timestamping";
              goto LAB_00102beb;
            }
            if ((*local_68 == 0) || (iVar2 = setsockopt(priv->sock,1,6,local_68,4), -1 < iVar2)) {
              iVar2 = bind(priv->sock,(sockaddr *)local_70,0x18);
              if (-1 < iVar2) {
                if (priv->todo_connect == true) {
                  if (priv->valid_peername == false) {
                    pcVar11 = "no peername supplied";
                    goto LAB_00102b39;
                  }
                  iVar2 = connect(priv->sock,(sockaddr *)local_78,0x18);
                  if (iVar2 < 0) {
                    pcVar11 = "connect()";
                    goto LAB_00102b39;
                  }
                }
                if (priv->todo_recv == true) {
                  __size = priv->max_transfer;
                  puVar4 = (uint8_t *)malloc(__size);
                  if (puVar4 == (uint8_t *)0x0) {
                    pcVar11 = "can\'t allocate rx buf";
                    goto LAB_00102b1b;
                  }
                  priv->last_dpo = -1;
                  goto LAB_0010276a;
                }
                iVar2 = 1;
                if (priv->todo_filesize != true) goto LAB_00102bbc;
                __fd = priv->infile;
                local_58 = (sockaddr_can *)lseek(__fd,0,2);
                if (local_58 == (sockaddr_can *)0xffffffffffffffff) {
                  pcVar11 = "%s lseek()\n";
                }
                else {
                  _Var6 = lseek(__fd,0,0);
                  if (_Var6 != -1) {
                    local_58 = (sockaddr_can *)((ulong)local_58 & 0xffffffff);
                    if (local_58 == (sockaddr_can *)0x0) goto LAB_00102bbc;
                    if (priv->repeat == 0) {
                      iVar2 = 0;
                      goto LAB_00102bbc;
                    }
                    uVar3 = 0;
                    break;
                  }
                  pcVar11 = "%s lseek() start\n";
                }
                pcVar10 = "j1939cat_get_file_size";
                goto LAB_00102c3b;
              }
              pcVar11 = "bind()";
            }
            else {
              pcVar11 = "setsockopt: filed to set broadcast";
            }
          }
        }
LAB_00102b39:
        warn(pcVar11);
        return 1;
      }
      uVar3 = strtoul(_optarg,(char **)0x0,0);
      priv->polltimeout = uVar3;
      goto LAB_001024b0;
    }
    *local_68 = 1;
  } while( true );
LAB_001028ca:
  psVar12 = local_58;
  priv->round = priv->round + 1;
  local_7c = priv->sock;
  local_5c = priv->infile;
  local_40 = (sockaddr_can *)priv->max_transfer;
  if (local_58 <= (sockaddr_can *)priv->max_transfer) {
    local_40 = local_58;
  }
  local_48 = uVar3;
  local_50 = (uint8_t *)malloc((size_t)local_40);
  if (local_50 != (uint8_t *)0x0) {
LAB_0010290b:
    puVar4 = local_50;
    psVar7 = psVar12;
    if (local_40 < psVar12) {
      psVar7 = local_40;
    }
    psVar7 = (sockaddr_can *)read(local_5c,local_50,(size_t)psVar7);
    if (psVar7 == (sockaddr_can *)0xffffffffffffffff) {
      iVar2 = 1;
      puVar4 = local_50;
      goto LAB_00102bb7;
    }
    if (psVar7 != (sockaddr_can *)0x0) {
      local_68 = (int *)(puVar4 + (long)psVar7);
      uVar8 = 0xc;
      local_78 = psVar7;
      local_70 = psVar12;
LAB_00102957:
      if (priv->polltimeout == 0) {
        uVar3 = j1939cat_send_one(priv,local_7c,puVar4,(size_t)psVar7);
        if ((long)uVar3 < 0) goto LAB_00102aad;
        bVar13 = false;
      }
      else {
        local_84.fd = priv->sock;
        local_84._4_4_ = uVar8;
        iVar2 = poll(&local_84,1,(int)priv->polltimeout);
        if (iVar2 == -1) {
          piVar5 = __errno_location();
          if (*piVar5 != -4) goto LAB_00102aaa;
          goto LAB_00102957;
        }
        if (iVar2 == 0) {
          uVar3 = 0xffffffc2;
          goto LAB_00102aad;
        }
        uVar9 = (uint)local_84.revents;
        if ((uVar8 & uVar9) == 0) {
          warn("%s: something else is wrong %x %x","j1939cat_send_loop",uVar9,uVar8);
          uVar3 = 0xfffffffb;
          goto LAB_00102aad;
        }
        if ((uVar9 & 8) == 0) {
          bVar13 = false;
        }
        else {
          uVar9 = j1939cat_recv_err(priv);
          if (uVar9 == 0xfffffffc) goto LAB_00102957;
          uVar3 = (ulong)uVar9;
          if (uVar9 != 0) goto LAB_00102aad;
          bVar13 = priv->repeat - 1 == (ulong)(priv->stats).tskey;
        }
        if ((local_84.revents & 4U) != 0) {
          uVar3 = j1939cat_send_one(priv,local_7c,puVar4,(size_t)psVar7);
          if (-1 < (long)uVar3) goto LAB_00102a14;
          goto LAB_00102aad;
        }
        uVar3 = 0;
      }
LAB_00102a14:
      if (local_68 < puVar4 + (long)psVar7) {
        warn("%s: send buffer is bigger than the read buffer","j1939cat_send_loop");
        iVar2 = -0x16;
        puVar4 = local_50;
        goto LAB_00102bb7;
      }
      puVar4 = puVar4 + uVar3;
      psVar7 = (sockaddr_can *)((long)psVar7 - uVar3);
      if (psVar7 == (sockaddr_can *)0x0) {
        bVar14 = priv->repeat != priv->round;
        if (!bVar14) {
          uVar8 = 8;
        }
        psVar7 = (sockaddr_can *)0x0;
        bVar13 = (bool)(bVar14 | bVar13);
      }
      if (bVar13) goto LAB_00102ab6;
      goto LAB_00102957;
    }
    goto LAB_00102ad4;
  }
  pcVar11 = "can\'t allocate buf";
LAB_00102b1b:
  warn(pcVar11);
  iVar2 = 1;
  goto LAB_00102bbc;
LAB_00102aaa:
  uVar3 = (ulong)(uint)-*piVar5;
LAB_00102aad:
  iVar2 = (int)uVar3;
  puVar4 = local_50;
  if (iVar2 != 0) goto LAB_00102bb7;
LAB_00102ab6:
  psVar12 = (sockaddr_can *)((long)local_70 - (long)local_78);
  puVar4 = local_50;
  if (psVar12 == (sockaddr_can *)0x0) goto LAB_00102ad4;
  goto LAB_0010290b;
LAB_00102ad4:
  free(puVar4);
  _Var6 = lseek(priv->infile,0,0);
  if (_Var6 == -1) {
    pcVar11 = "%s lseek() start\n";
    pcVar10 = "j1939cat_send";
LAB_00102c3b:
    err(1,pcVar11,pcVar10);
  }
  uVar3 = (ulong)((int)local_48 + 1);
  iVar2 = 0;
  if (priv->repeat <= uVar3) goto LAB_00102bbc;
  goto LAB_001028ca;
LAB_0010276a:
  do {
    if (priv->polltimeout == 0) {
      iVar2 = j1939cat_recv_one(priv,puVar4,__size);
      if (iVar2 != 0) {
        iVar2 = 1;
        goto LAB_00102bb7;
      }
    }
    else {
      local_84.fd = priv->sock;
      local_84.events = 9;
      local_84.revents = 0;
      iVar2 = poll(&local_84,1,(int)priv->polltimeout);
      if (iVar2 != 0) {
        if (iVar2 == -1) {
          piVar5 = __errno_location();
          if (*piVar5 != -4) {
            iVar2 = -*piVar5;
            goto LAB_00102bbc;
          }
        }
        else {
          if (((int)local_84.revents & 9U) == 0) {
            warn("%s: something else is wrong %x %x","j1939cat_recv",(int)local_84.revents,9);
            iVar2 = -5;
            goto LAB_00102bbc;
          }
          if ((local_84._4_4_ & 0x80000) != 0) {
            iVar2 = j1939cat_recv_err(priv);
            if (iVar2 == -4) goto LAB_001027c0;
            if (iVar2 != 0) goto LAB_00102bbc;
          }
          if ((local_84.revents & 1U) != 0) {
            j1939cat_recv_one(priv,puVar4,__size);
          }
        }
      }
    }
LAB_001027c0:
  } while (priv->todo_recv != false);
  iVar2 = 0;
LAB_00102bb7:
  free(puVar4);
LAB_00102bbc:
  close(priv->infile);
  close(priv->outfile);
  close(priv->sock);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939cat_priv *priv;
	int ret = 0;

	priv = calloc(1, sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	priv->todo_prio = -1;
	priv->infile = STDIN_FILENO;
	priv->outfile = STDOUT_FILENO;
	priv->max_transfer = J1939_MAX_ETP_PACKET_SIZE;
	priv->polltimeout = 100000;
	priv->repeat = 1;

	j1939cat_init_sockaddr_can(&priv->sockname);
	j1939cat_init_sockaddr_can(&priv->peername);

	ret = j1939cat_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	ret = j1939cat_sock_prepare(priv);
	if (ret)
		return ret;

	if (priv->todo_recv)
		ret = j1939cat_recv(priv);
	else
		ret = j1939cat_send(priv);

	close(priv->infile);
	close(priv->outfile);
	close(priv->sock);

	return ret;
}